

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

iterator __thiscall
QHash<QStringView,QXmlStreamReaderPrivate::Entity>::emplace<QXmlStreamReaderPrivate::Entity_const&>
          (QHash<QStringView,QXmlStreamReaderPrivate::Entity> *this,QStringView *key,Entity *args)

{
  Data *pDVar1;
  ulong uVar2;
  long in_FS_OFFSET;
  piter pVar3;
  Entity local_60;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = *(Data **)this;
  if (pDVar1 == (Data *)0x0) {
    local_60.name.d.d = (Data *)0x0;
LAB_0035bed0:
    QHash<QStringView,_QXmlStreamReaderPrivate::Entity>::detach
              ((QHash<QStringView,_QXmlStreamReaderPrivate::Entity> *)this);
    pVar3 = (piter)emplace_helper<QXmlStreamReaderPrivate::Entity_const&>(this,key,args);
    QHash<QStringView,_QXmlStreamReaderPrivate::Entity>::~QHash
              ((QHash<QStringView,_QXmlStreamReaderPrivate::Entity> *)&local_60);
  }
  else {
    if (1 < (uint)(pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i) {
      local_60.name.d.d = pDVar1;
      if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i != -1) {
        LOCK();
        (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      goto LAB_0035bed0;
    }
    uVar2._0_4_ = pDVar1[1].super_QArrayData.ref_;
    uVar2._4_4_ = pDVar1[1].super_QArrayData.flags;
    if ((ulong)(pDVar1->super_QArrayData).alloc < uVar2 >> 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        pVar3 = (piter)emplace_helper<QXmlStreamReaderPrivate::Entity_const&>(this,key,args);
        return (iterator)pVar3;
      }
      goto LAB_0035bf84;
    }
    QXmlStreamReaderPrivate::Entity::Entity(&local_60,args);
    pVar3 = (piter)QHash<QStringView,_QXmlStreamReaderPrivate::Entity>::
                   emplace_helper<QXmlStreamReaderPrivate::Entity>
                             ((QHash<QStringView,_QXmlStreamReaderPrivate::Entity> *)this,key,
                              &local_60);
    QXmlStreamReaderPrivate::Entity::~Entity(&local_60);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (iterator)pVar3;
  }
LAB_0035bf84:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }